

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlAttrPtr xmlSetNsProp(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value)

{
  int iVar1;
  _xmlNode *attr;
  xmlChar *pxVar2;
  _xmlNode *p_Var3;
  xmlAttrPtr pxVar4;
  _xmlNode *p_Var5;
  xmlDoc *doc;
  _xmlNode *p_Var6;
  
  if (ns == (xmlNsPtr)0x0) {
    pxVar2 = (xmlChar *)0x0;
  }
  else {
    pxVar2 = ns->href;
    if (pxVar2 == (xmlChar *)0x0) {
      return (xmlAttrPtr)0x0;
    }
  }
  attr = (_xmlNode *)xmlGetPropNodeInternal(node,name,pxVar2,0);
  if (attr != (_xmlNode *)0x0) {
    if (*(xmlAttributeType *)&attr->content == XML_ATTRIBUTE_ID) {
      xmlRemoveID(node->doc,(xmlAttrPtr)attr);
      *(xmlAttributeType *)&attr->content = XML_ATTRIBUTE_ID;
    }
    if (attr->children != (xmlNodePtr)0x0) {
      xmlFreeNodeList(attr->children);
    }
    attr->children = (_xmlNode *)0x0;
    attr->last = (_xmlNode *)0x0;
    attr->ns = ns;
    if (value != (xmlChar *)0x0) {
      iVar1 = xmlCheckUTF8(value);
      doc = node->doc;
      if (iVar1 == 0) {
        xmlTreeErr(0x517,(xmlNodePtr)doc,(char *)0x0);
        doc = (xmlDoc *)0x0;
        if (node->doc != (_xmlDoc *)0x0) {
          pxVar2 = xmlStrdup((xmlChar *)"ISO-8859-1");
          doc = node->doc;
          doc->encoding = pxVar2;
        }
      }
      p_Var3 = xmlNewDocText(doc,value);
      attr->children = p_Var3;
      p_Var6 = (_xmlNode *)0x0;
      while (p_Var5 = p_Var3, p_Var5 != (_xmlNode *)0x0) {
        p_Var5->parent = attr;
        p_Var3 = p_Var5->next;
        if (p_Var3 == (_xmlNode *)0x0) {
          p_Var6 = p_Var5;
        }
      }
      attr->last = p_Var6;
    }
    if (*(int *)&attr->content == 2) {
      xmlAddID((xmlValidCtxtPtr)0x0,node->doc,value,(xmlAttrPtr)attr);
    }
    return (xmlAttrPtr)attr;
  }
  pxVar4 = xmlNewPropInternal(node,ns,name,value,0);
  return pxVar4;
}

Assistant:

xmlAttrPtr
xmlSetNsProp(xmlNodePtr node, xmlNsPtr ns, const xmlChar *name,
	     const xmlChar *value)
{
    xmlAttrPtr prop;

    if (ns && (ns->href == NULL))
	return(NULL);
    prop = xmlGetPropNodeInternal(node, name, (ns != NULL) ? ns->href : NULL, 0);
    if (prop != NULL) {
	/*
	* Modify the attribute's value.
	*/
	if (prop->atype == XML_ATTRIBUTE_ID) {
	    xmlRemoveID(node->doc, prop);
	    prop->atype = XML_ATTRIBUTE_ID;
	}
	if (prop->children != NULL)
	    xmlFreeNodeList(prop->children);
	prop->children = NULL;
	prop->last = NULL;
	prop->ns = ns;
	if (value != NULL) {
	    xmlNodePtr tmp;

	    if(!xmlCheckUTF8(value)) {
	        xmlTreeErr(XML_TREE_NOT_UTF8, (xmlNodePtr) node->doc,
	                   NULL);
                if (node->doc != NULL)
                    node->doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
	    }
	    prop->children = xmlNewDocText(node->doc, value);
	    prop->last = NULL;
	    tmp = prop->children;
	    while (tmp != NULL) {
		tmp->parent = (xmlNodePtr) prop;
		if (tmp->next == NULL)
		    prop->last = tmp;
		tmp = tmp->next;
	    }
	}
	if (prop->atype == XML_ATTRIBUTE_ID)
	    xmlAddID(NULL, node->doc, value, prop);
	return(prop);
    }
    /*
    * No equal attr found; create a new one.
    */
    return(xmlNewPropInternal(node, ns, name, value, 0));
}